

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O2

void NULLCIO::DefaultInitialize(void)

{
  return;
}

Assistant:

void DefaultInitialize()
	{
#if defined(_MSC_VER)
		static bool initialized = false;

		if(!initialized)
		{
			AllocConsole();

			freopen("CONOUT$", "w", stdout);
			freopen("CONIN$", "r", stdin);

			initialized = true;
		}
#endif
	}